

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::gjInverse(Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this)

{
  ulong uVar1;
  uint uVar2;
  float (*pafVar3) [4];
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  float (*pafVar8) [4];
  float (*pafVar9) [4];
  float *pfVar10;
  float (*pafVar11) [4];
  ulong uVar12;
  float (*pafVar13) [4];
  long lVar14;
  float (*pafVar15) [4];
  ulong uVar16;
  float (*pafVar17) [4];
  float fVar18;
  float fVar19;
  float fVar20;
  Matrix44<float> t;
  Matrix44<float> s;
  
  pafVar11 = (float (*) [4])&s;
  s.x[0][0] = 1.0;
  s.x[0][1] = 0.0;
  s.x[0][2] = 0.0;
  s.x[0][3] = 0.0;
  s.x[1][0] = 0.0;
  s.x[1][1] = 1.0;
  s.x[1][2] = 0.0;
  s.x[1][3] = 0.0;
  s.x[2][0] = 0.0;
  s.x[2][1] = 0.0;
  s.x[2][2] = 1.0;
  s.x[2][3] = 0.0;
  s.x[3][0] = 0.0;
  s.x[3][1] = 0.0;
  s.x[3][2] = 0.0;
  s.x[3][3] = 1.0;
  pafVar13 = (float (*) [4])&t;
  Matrix44((Matrix44<float> *)pafVar13,this);
  pafVar3 = t.x + 1;
  uVar4 = 1;
  lVar5 = 0x30;
  pafVar8 = s.x;
  pafVar9 = pafVar3;
  uVar16 = 0;
  while (pafVar8 = pafVar8 + 1, uVar16 != 3) {
    pfVar10 = (float *)((long)t.x + uVar16 * 0x14);
    fVar19 = *pfVar10;
    fVar18 = -fVar19;
    if (-fVar19 <= fVar19) {
      fVar18 = fVar19;
    }
    uVar12 = uVar4 & 0xffffffff;
    uVar7 = uVar16 & 0xffffffff;
    for (lVar14 = 0; lVar5 != lVar14; lVar14 = lVar14 + 0x10) {
      fVar19 = *(float *)((long)*pafVar9 + lVar14);
      fVar20 = -fVar19;
      if (-fVar19 <= fVar19) {
        fVar20 = fVar19;
      }
      uVar1 = uVar12;
      if (fVar20 <= fVar18) {
        fVar20 = fVar18;
        uVar1 = uVar7;
      }
      uVar7 = uVar1;
      fVar18 = fVar20;
      uVar12 = (ulong)((int)uVar12 + 1);
    }
    if ((fVar18 == 0.0) && (!NAN(fVar18))) goto LAB_00159c0d;
    iVar6 = (int)uVar7;
    pafVar15 = pafVar8;
    pafVar17 = pafVar3;
    uVar12 = uVar4;
    if (uVar16 != uVar7) {
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        fVar19 = (*(float (*) [4])*pafVar13)[lVar14];
        (*(float (*) [4])*pafVar13)[lVar14] = t.x[iVar6][lVar14];
        t.x[iVar6][lVar14] = fVar19;
        fVar19 = (*(float (*) [4])*pafVar11)[lVar14];
        (*(float (*) [4])*pafVar11)[lVar14] = s.x[iVar6][lVar14];
        s.x[iVar6][lVar14] = fVar19;
      }
    }
    for (; uVar12 != 4; uVar12 = uVar12 + 1) {
      fVar19 = -t.x[uVar12][uVar16] / *pfVar10;
      for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 4) {
        *(float *)((long)*pafVar17 + lVar14) =
             *(float *)((long)*(float (*) [4])*pafVar13 + lVar14) * fVar19 +
             *(float *)((long)*pafVar17 + lVar14);
        *(float *)((long)*pafVar15 + lVar14) =
             *(float *)((long)*(float (*) [4])*pafVar11 + lVar14) * fVar19 +
             *(float *)((long)*pafVar15 + lVar14);
      }
      pafVar15 = pafVar15 + 1;
      pafVar17 = pafVar17 + 1;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + -0x10;
    pafVar9 = (float (*) [4])(pafVar9[1] + 1);
    pafVar13 = pafVar13 + 1;
    pafVar11 = pafVar11 + 1;
    pafVar3 = pafVar3 + 1;
    uVar16 = uVar16 + 1;
  }
  uVar2 = 3;
  while( true ) {
    if ((int)uVar2 < 0) {
      Matrix44(__return_storage_ptr__,&s);
      return __return_storage_ptr__;
    }
    uVar4 = (ulong)uVar2;
    fVar19 = *(float *)((long)t.x + uVar4 * 0x14);
    if ((fVar19 == 0.0) && (!NAN(fVar19))) break;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      t.x[uVar4][lVar5] = t.x[uVar4][lVar5] / fVar19;
      s.x[uVar4][lVar5] = s.x[uVar4][lVar5] / fVar19;
    }
    pafVar11 = (float (*) [4])&s;
    pafVar13 = (float (*) [4])&t;
    for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
      fVar19 = -t.x[uVar16][uVar4];
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        (*(float (*) [4])*pafVar13)[lVar5] =
             t.x[uVar4][lVar5] * fVar19 + (*(float (*) [4])*pafVar13)[lVar5];
        (*(float (*) [4])*pafVar11)[lVar5] =
             s.x[uVar4][lVar5] * fVar19 + (*(float (*) [4])*pafVar11)[lVar5];
      }
      pafVar13 = pafVar13 + 1;
      pafVar11 = pafVar11 + 1;
    }
    uVar2 = uVar2 - 1;
  }
LAB_00159c0d:
  __return_storage_ptr__->x[0][0] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  __return_storage_ptr__->x[1][1] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE inline Matrix44<T>
Matrix44<T>::gjInverse () const IMATH_NOEXCEPT
{
    int      i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0) { return Matrix44 (); }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t.x[i][i]) == 0) { return Matrix44 (); }

        for (j = 0; j < 4; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}